

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)29,(moira::Mode)3,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  uint uVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)3,_1> dst;
  u32 local_2c;
  ushort local_28;
  
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  local_28 = op & 7;
  local_2c = *addr;
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar4 = 'b';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "bset"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar1);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar3);
  }
  else {
    cVar4 = 'b';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "bset"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar1);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(UInt)(uVar3 & 0xff));
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_1> *)&local_2c);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<S>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu<S>(src) << Sep{} << dst;
    }
}